

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O1

void generate_gf(void)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  alpha_of[8] = 0;
  uVar1 = 1;
  lVar2 = 0;
  lVar3 = 0;
  do {
    *(uint *)((long)alpha_of + lVar2) = uVar1;
    index_of[uVar1] = (uint)lVar3;
    if (*(int *)((long)p + lVar2) != 0) {
      alpha_of[8] = alpha_of[8] ^ uVar1;
    }
    uVar1 = uVar1 * 2;
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 4;
  } while (lVar3 != 8);
  index_of[alpha_of[8]] = 8;
  lVar2 = 9;
  do {
    uVar1 = *(uint *)(lVar2 * 4 + 0x10509c);
    if (uVar1 < 0x80) {
      uVar1 = uVar1 * 2;
    }
    else {
      uVar1 = uVar1 * 2 ^ alpha_of[8] ^ 0x100;
    }
    alpha_of[lVar2] = uVar1;
    index_of[uVar1] = (uint)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xff);
  index_of[0] = 0xffffffff;
  return;
}

Assistant:

void generate_gf()
{
    uint32_t i, mask;

    mask = 1;
    alpha_of[m] = 0;

    for (i = 0; i < m; i++)
    {
        alpha_of[i] = mask;
        index_of[alpha_of[i]] = i;

        if (p[i] != 0)
            alpha_of[m] ^= mask;
        mask <<= 1;
    }
    index_of[alpha_of[m]] = m;
    mask >>= 1;

    for (i = m + 1; i < pow2(m) - 1; i++)
    {
        if (alpha_of[i - 1] >= mask)
            alpha_of[i] = alpha_of[m] ^ ((alpha_of[i - 1] ^ mask) << 1);
        else
            alpha_of[i] = alpha_of[i - 1] << 1;

        index_of[alpha_of[i]] = i;
    }
    index_of[0] = -1;
}